

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O2

void __thiscall
slang::syntax::EmptyMemberSyntax::setChild(EmptyMemberSyntax *this,size_t index,TokenOrSyntax child)

{
  SyntaxNode *pSVar1;
  undefined4 uVar2;
  SyntaxNode *pSVar3;
  Token TVar4;
  
  if (index == 2) {
    TVar4 = ConstTokenOrSyntax::token(&child.super_ConstTokenOrSyntax);
    (this->semi).kind = TVar4.kind;
    (this->semi).field_0x2 = TVar4._2_1_;
    (this->semi).numFlags = (NumericTokenFlags)TVar4.numFlags.raw;
    (this->semi).rawLen = TVar4.rawLen;
    (this->semi).info = TVar4.info;
  }
  else if (index == 1) {
    pSVar3 = TokenOrSyntax::node(&child);
    uVar2 = *(undefined4 *)&pSVar3->field_0x4;
    pSVar1 = pSVar3->parent;
    (this->qualifiers).super_SyntaxListBase.super_SyntaxNode.kind = pSVar3->kind;
    *(undefined4 *)&(this->qualifiers).super_SyntaxListBase.super_SyntaxNode.field_0x4 = uVar2;
    (this->qualifiers).super_SyntaxListBase.super_SyntaxNode.parent = pSVar1;
    (this->qualifiers).super_SyntaxListBase.super_SyntaxNode.previewNode = pSVar3->previewNode;
    (this->qualifiers).super_SyntaxListBase.childCount = *(size_t *)(pSVar3 + 1);
    pSVar1 = pSVar3[1].previewNode;
    (this->qualifiers).super_span<slang::parsing::Token,_18446744073709551615UL>._M_ptr =
         (pointer)pSVar3[1].parent;
    (this->qualifiers).super_span<slang::parsing::Token,_18446744073709551615UL>._M_extent.
    _M_extent_value = (size_t)pSVar1;
  }
  else {
    pSVar3 = TokenOrSyntax::node(&child);
    uVar2 = *(undefined4 *)&pSVar3->field_0x4;
    pSVar1 = pSVar3->parent;
    (this->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.kind = pSVar3->kind;
    *(undefined4 *)
     &(this->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.field_0x4 = uVar2;
    (this->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.parent = pSVar1;
    (this->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.previewNode =
         pSVar3->previewNode;
    (this->super_MemberSyntax).attributes.super_SyntaxListBase.childCount = *(size_t *)(pSVar3 + 1);
    pSVar1 = pSVar3[1].previewNode;
    (this->super_MemberSyntax).attributes.
    super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_ptr =
         (pointer)pSVar3[1].parent;
    (this->super_MemberSyntax).attributes.
    super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_extent.
    _M_extent_value = (size_t)pSVar1;
  }
  return;
}

Assistant:

void EmptyMemberSyntax::setChild(size_t index, TokenOrSyntax child) {
    switch (index) {
        case 0: attributes = child.node()->as<SyntaxList<AttributeInstanceSyntax>>(); return;
        case 1: qualifiers = child.node()->as<TokenList>(); return;
        case 2: semi = child.token(); return;
        default: SLANG_UNREACHABLE;
    }
}